

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O0

void jpc_mqdec_init(jpc_mqdec_t *mqdec)

{
  byte *pbVar1;
  int iVar2;
  uint local_20;
  uint local_1c;
  uint local_18;
  uchar local_14;
  int c;
  jpc_mqdec_t *mqdec_local;
  
  mqdec->eof = 0;
  mqdec->creg = 0;
  if ((mqdec->in->flags_ & 7U) == 0) {
    if ((mqdec->in->rwlimit_ < 0) || (mqdec->in->rwcnt_ < mqdec->in->rwlimit_)) {
      iVar2 = mqdec->in->cnt_ + -1;
      mqdec->in->cnt_ = iVar2;
      if (iVar2 < 0) {
        local_1c = jas_stream_fillbuf(mqdec->in,1);
      }
      else {
        mqdec->in->rwcnt_ = mqdec->in->rwcnt_ + 1;
        pbVar1 = mqdec->in->ptr_;
        mqdec->in->ptr_ = pbVar1 + 1;
        local_1c = (uint)*pbVar1;
      }
      local_18 = local_1c;
    }
    else {
      mqdec->in->flags_ = mqdec->in->flags_ | 4;
      local_18 = 0xffffffff;
    }
    local_20 = local_18;
  }
  else {
    local_20 = 0xffffffff;
  }
  local_14 = (uchar)local_20;
  if (local_20 == 0xffffffff) {
    local_14 = 0xff;
    mqdec->eof = 1;
  }
  mqdec->inbuffer = local_14;
  mqdec->creg = (long)(int)((uint)mqdec->inbuffer << 0x10) + mqdec->creg;
  jpc_mqdec_bytein(mqdec);
  mqdec->creg = mqdec->creg << 7;
  mqdec->ctreg = mqdec->ctreg - 7;
  mqdec->areg = 0x8000;
  return;
}

Assistant:

void jpc_mqdec_init(jpc_mqdec_t *mqdec)
{
	int c;

	mqdec->eof = 0;
	mqdec->creg = 0;
	/* Get the next byte from the input stream. */
	if ((c = jas_stream_getc(mqdec->in)) == EOF) {
		/* We have encountered an I/O error or EOF. */
		c = 0xff;
		mqdec->eof = 1;
	}
	mqdec->inbuffer = c;
	mqdec->creg += mqdec->inbuffer << 16;
	jpc_mqdec_bytein(mqdec);
	mqdec->creg <<= 7;
	mqdec->ctreg -= 7;
	mqdec->areg = 0x8000;
}